

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

void __thiscall
embree::SceneGraph::LightNodeImpl<embree::SceneGraph::DistantLight>::LightNodeImpl
          (LightNodeImpl<embree::SceneGraph::DistantLight> *this,DistantLight *light)

{
  undefined8 uVar1;
  float fVar2;
  
  LightNode::LightNode(&this->super_LightNode);
  (this->super_LightNode).super_Node.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__Node_002ada18;
  (this->light).super_Light.type = (light->super_Light).type;
  uVar1 = *(undefined8 *)((long)&(light->D).field_0 + 8);
  *(undefined8 *)&(this->light).D.field_0 = *(undefined8 *)&(light->D).field_0;
  *(undefined8 *)((long)&(this->light).D.field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&(light->L).field_0 + 8);
  *(undefined8 *)&(this->light).L.field_0 = *(undefined8 *)&(light->L).field_0;
  *(undefined8 *)((long)&(this->light).L.field_0 + 8) = uVar1;
  fVar2 = light->radHalfAngle;
  (this->light).halfAngle = light->halfAngle;
  (this->light).radHalfAngle = fVar2;
  (this->light).cosHalfAngle = light->cosHalfAngle;
  return;
}

Assistant:

LightNodeImpl (const Light& light)
        : light(light) {}